

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_setreturns(FuncState *fs,expdesc *e,int nresults)

{
  Instruction *pIVar1;
  long lVar2;
  
  if (e->k == VVARARG) {
    lVar2 = (long)(e->u).info;
    pIVar1 = fs->f->code;
    *(char *)((long)pIVar1 + lVar2 * 4 + 3) = (char)nresults + '\x01';
    if (((byte)ravi_parser_debug & 2) != 0) {
      raviY_printf(fs,"[%d]* %o ; set B to %d\n",(ulong)(uint)(e->u).info,(ulong)pIVar1[lVar2]);
    }
    *(byte *)((long)pIVar1 + lVar2 * 4 + 1) = fs->freereg & 0x7f;
    if (((byte)ravi_parser_debug & 2) != 0) {
      raviY_printf(fs,"[%d]* %o ; set A to %d\n",(ulong)(uint)(e->u).info,(ulong)pIVar1[lVar2],
                   (ulong)fs->freereg);
    }
    luaK_checkstack(fs,1);
    fs->freereg = fs->freereg + '\x01';
  }
  else if (e->k == VCALL) {
    *(char *)((long)fs->f->code + (long)(e->u).info * 4 + 2) = (char)nresults + '\x01';
    if (((byte)ravi_parser_debug & 2) != 0) {
      raviY_printf(fs,"[%d]* %o ; set C to %d\n",(long)(e->u).info,(ulong)fs->f->code[(e->u).info]);
      return;
    }
  }
  else if (nresults != -1) {
    __assert_fail("nresults == (-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                  ,0x21c,"void luaK_setreturns(FuncState *, expdesc *, int)");
  }
  return;
}

Assistant:

void luaK_setreturns (FuncState *fs, expdesc *e, int nresults) {
  if (e->k == VCALL) {  /* expression is an open function call? */
    SETARG_C(getinstruction(fs, e), nresults + 1);
    DEBUG_CODEGEN(raviY_printf(fs, "[%d]* %o ; set C to %d\n", e->u.info, getinstruction(fs,e), nresults+1));
  }
  else if (e->k == VVARARG) {
    Instruction *pc = &getinstruction(fs, e);
    SETARG_B(*pc, nresults + 1);
    DEBUG_CODEGEN(raviY_printf(fs, "[%d]* %o ; set B to %d\n", e->u.info, *pc, nresults + 1));
    SETARG_A(*pc, fs->freereg);
    DEBUG_CODEGEN(raviY_printf(fs, "[%d]* %o ; set A to %d\n", e->u.info, *pc, fs->freereg));
    luaK_reserveregs(fs, 1);
  }
  else lua_assert(nresults == LUA_MULTRET);
}